

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O2

void __thiscall cmLocalGenerator::IssueMessage(cmLocalGenerator *this,MessageType t,string *text)

{
  string *source;
  bool bVar1;
  cmListFileContext lfc;
  string local_68;
  cmOutputConverter converter;
  
  lfc.Name._M_dataplus._M_p = (pointer)&lfc.Name.field_2;
  lfc.Name._M_string_length = 0;
  lfc.Name.field_2._M_local_buf[0] = '\0';
  lfc.FilePath._M_dataplus._M_p = (pointer)&lfc.FilePath.field_2;
  lfc.FilePath._M_string_length = 0;
  lfc.FilePath.field_2._M_local_buf[0] = '\0';
  lfc.Line = 0;
  cmState::Snapshot::GetCurrentSourceDirectory(&this->StateSnapshot);
  source = &lfc.FilePath;
  std::__cxx11::string::assign((char *)source);
  std::__cxx11::string::append((char *)source);
  bVar1 = cmake::GetIsInTryCompile(this->GlobalGenerator->CMakeInstance);
  if (!bVar1) {
    cmOutputConverter::cmOutputConverter(&converter,this->StateSnapshot);
    cmOutputConverter::Convert(&local_68,&converter,source,HOME,UNCHANGED);
    std::__cxx11::string::operator=((string *)source,(string *)&local_68);
    std::__cxx11::string::~string((string *)&local_68);
  }
  lfc.Line = 0;
  cmake::IssueMessage(this->GlobalGenerator->CMakeInstance,t,text,&lfc);
  cmListFileContext::~cmListFileContext(&lfc);
  return;
}

Assistant:

void cmLocalGenerator::IssueMessage(cmake::MessageType t,
                                    std::string const& text) const
{
  cmListFileContext lfc;
  lfc.FilePath = this->StateSnapshot.GetCurrentSourceDirectory();
  lfc.FilePath += "/CMakeLists.txt";

  if(!this->GlobalGenerator->GetCMakeInstance()->GetIsInTryCompile())
    {
    cmOutputConverter converter(this->StateSnapshot);
    lfc.FilePath = converter.Convert(lfc.FilePath, cmLocalGenerator::HOME);
    }
  lfc.Line = 0;
  this->GlobalGenerator->GetCMakeInstance()->IssueMessage(t, text, lfc);
}